

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDownLatch.cc
# Opt level: O1

__pid_t __thiscall tt::CountDownLatch::wait(CountDownLatch *this,void *__stat_loc)

{
  int iVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  while (0 < this->m_count) {
    pthread_cond_wait((pthread_cond_t *)&(this->m_condition).m_cond,
                      (pthread_mutex_t *)(this->m_condition).m_mutex);
  }
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return iVar1;
}

Assistant:

void tt::CountDownLatch::wait(){
	MutexLockGuard lock(m_mutex);
	while(m_count > 0) { m_condition.wait(); }
}